

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrsIntersect.cpp
# Opt level: O0

bool GeoCalcs::CrsIntersect
               (LLPoint *llPt1,double az13,double *az31,double *dist13,LLPoint *llPt2,double az23,
               double *az32,double *dist23,double dTol,LLPoint *llIntersect)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  LLPoint LVar11;
  bool local_1ea;
  undefined1 local_1a0 [8];
  LLPoint newPt;
  double dStack_188;
  int k;
  double dErr;
  int nMaxCount;
  double local_158;
  double errarray [2];
  double distarray [2];
  bool bSwapped;
  undefined1 local_108 [8];
  LLPoint llInv;
  double b;
  double a;
  double sinC;
  double cosC;
  double C;
  double sinB;
  double cosB;
  double sinA;
  double cosA;
  double angle2;
  double angle1;
  InverseResult result;
  LLPoint pt2;
  LLPoint pt1;
  double dTol_local;
  double *dist23_local;
  double *az32_local;
  double az23_local;
  LLPoint *llPt2_local;
  double *dist13_local;
  double *az31_local;
  double az13_local;
  LLPoint *llPt1_local;
  
  pt2.longitude = llPt1->latitude;
  result.distance = llPt2->latitude;
  pt2.latitude = llPt2->longitude;
  az32_local = (double *)az23;
  az23_local = (double)llPt2;
  llPt2_local = (LLPoint *)dist13;
  dist13_local = az31;
  az31_local = (double *)az13;
  az13_local = (double)llPt1;
  INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&angle1);
  DistVincenty((LLPoint *)&pt2.longitude,(LLPoint *)&result.distance,(InverseResult *)&angle1);
  dVar3 = SignAzimuthDifference((double)az31_local,angle1);
  angle2 = ABS(dVar3);
  dVar3 = SignAzimuthDifference(result.azimuth,(double)az32_local);
  cosA = ABS(dVar3);
  if ((angle2 < 0.0) && (cosA < 0.0)) {
    angle2 = -angle2;
    cosA = -cosA;
  }
  dVar3 = sin(angle2);
  if ((dVar3 == 0.0) && (!NAN(dVar3))) {
    dVar3 = sin(cosA);
    if ((dVar3 == 0.0) && (!NAN(dVar3))) {
      return false;
    }
  }
  dVar4 = cos(angle2);
  dVar5 = sin(angle2);
  dVar6 = cos(cosA);
  dVar7 = sin(cosA);
  dVar3 = cos(result.reverseAzimuth / kSphereRadius);
  dVar3 = acos(-dVar4 * dVar6 + dVar5 * dVar7 * dVar3);
  dVar8 = cos(dVar3);
  dVar9 = sin(dVar3);
  dVar3 = kSphereRadius;
  dVar10 = acos((dVar6 * dVar8 + dVar4) / (dVar7 * dVar9));
  dVar7 = kSphereRadius;
  dVar4 = acos((dVar4 * dVar8 + dVar6) / (dVar5 * dVar9));
  uVar2 = std::isnan(dVar3 * dVar10);
  if (((uVar2 & 1) == 0) && (uVar2 = std::isnan(dVar7 * dVar4), (uVar2 & 1) == 0)) {
    LVar11 = DestVincenty((LLPoint *)&pt2.longitude,(double)az31_local,dVar7 * dVar4);
    llInv.longitude = LVar11.latitude;
    llIntersect->latitude = llInv.longitude;
    llIntersect->longitude = LVar11.longitude;
    DistVincenty((LLPoint *)&pt2.longitude,llIntersect,(InverseResult *)&angle1);
    llPt2_local->latitude = result.reverseAzimuth;
    local_108 = (undefined1  [8])-llIntersect->latitude;
    llInv.latitude = (llIntersect->longitude + 3.141592653589793) - 6.283185307179586;
    DistVincenty((LLPoint *)&pt2.longitude,(LLPoint *)local_108,(InverseResult *)&angle1);
    if (result.reverseAzimuth < llPt2_local->latitude) {
      llIntersect->latitude = (double)local_108;
      llIntersect->longitude = llInv.latitude;
      llPt2_local->latitude = result.reverseAzimuth;
      *dist13_local = result.azimuth;
      az31_local = (double *)((double)az31_local + 3.141592653589793);
      az32_local = (double *)((double)az32_local + 3.141592653589793);
    }
    DistVincenty((LLPoint *)&result.distance,llIntersect,(InverseResult *)&angle1);
    *dist23 = result.reverseAzimuth;
    dVar3 = llPt2_local->latitude;
    dVar7 = NmToMeters(1.0);
    if (dVar3 < dVar7) {
      dVar3 = (double)az31_local + 3.141592653589793;
      dVar7 = NmToMeters(1.0);
      LVar11 = DestVincenty((LLPoint *)&pt2.longitude,dVar3,dVar7);
      pt2.longitude = LVar11.latitude;
      DistVincenty((LLPoint *)&pt2.longitude,llIntersect,(InverseResult *)&angle1);
      az31_local = (double *)angle1;
    }
    dVar3 = *dist23;
    dVar7 = NmToMeters(1.0);
    if (dVar3 < dVar7) {
      dVar3 = (double)az32_local + 3.141592653589793;
      dVar7 = NmToMeters(1.0);
      LVar11 = DestVincenty((LLPoint *)&result.distance,dVar3,dVar7);
      result.distance = LVar11.latitude;
      pt2.latitude = LVar11.longitude;
      DistVincenty((LLPoint *)&result.distance,llIntersect,(InverseResult *)&angle1);
      az32_local = (double *)angle1;
    }
    bVar1 = *dist23 < llPt2_local->latitude;
    if (bVar1) {
      std::swap<GeoCalcs::LLPOINT>((LLPOINT *)&pt2.longitude,(LLPOINT *)&result.distance);
      std::swap<double>((double *)&az31_local,(double *)&az32_local);
      llPt2_local->latitude = *dist23;
    }
    errarray[1] = llPt2_local->latitude;
    distarray[0] = llPt2_local->latitude * 1.01;
    LVar11 = DestVincenty((LLPoint *)&pt2.longitude,(double)az31_local,llPt2_local->latitude);
    llIntersect->latitude = LVar11.latitude;
    llIntersect->longitude = LVar11.longitude;
    DistVincenty((LLPoint *)&result.distance,llIntersect,(InverseResult *)&angle1);
    local_158 = SignAzimuthDifference(angle1,(double)az32_local);
    LVar11 = DestVincenty((LLPoint *)&pt2.longitude,(double)az31_local,distarray[0]);
    llIntersect->latitude = LVar11.latitude;
    llIntersect->longitude = LVar11.longitude;
    DistVincenty((LLPoint *)&result.distance,llIntersect,(InverseResult *)&angle1);
    errarray[0] = SignAzimuthDifference(angle1,(double)az32_local);
    dStack_188 = 0.0;
    newPt.longitude._4_4_ = 0;
    while( true ) {
      local_1ea = true;
      if (newPt.longitude._4_4_ != 0) {
        local_1ea = dTol < dStack_188 && newPt.longitude._4_4_ < 0x10;
      }
      if (!local_1ea) break;
      FindLinearRoot(errarray + 1,&local_158,&llPt2_local->latitude);
      uVar2 = std::isnan(llPt2_local->latitude);
      if ((uVar2 & 1) != 0) break;
      LVar11 = DestVincenty((LLPoint *)&pt2.longitude,(double)az31_local,llPt2_local->latitude);
      local_1a0 = (undefined1  [8])LVar11.latitude;
      newPt.latitude = LVar11.longitude;
      DistVincenty((LLPoint *)&result.distance,(LLPoint *)local_1a0,(InverseResult *)&angle1);
      local_158 = errarray[0];
      errarray[0] = SignAzimuthDifference(angle1,(double)az32_local);
      errarray[1] = distarray[0];
      distarray[0] = llPt2_local->latitude;
      DistVincenty((LLPoint *)local_1a0,llIntersect,(InverseResult *)&angle1);
      dStack_188 = result.reverseAzimuth;
      llIntersect->latitude = (double)local_1a0;
      llIntersect->longitude = newPt.latitude;
      newPt.longitude._4_4_ = newPt.longitude._4_4_ + 1;
    }
    if ((newPt.longitude._4_4_ < 0x10) || (dStack_188 <= 1e-08)) {
      if (bVar1) {
        std::swap<GeoCalcs::LLPOINT>((LLPOINT *)&pt2.longitude,(LLPOINT *)&result.distance);
        std::swap<double>((double *)&az31_local,(double *)&az32_local);
        llPt2_local->latitude = *dist23;
      }
      DistVincenty(llIntersect,(LLPoint *)&pt2.longitude,(InverseResult *)&angle1);
      *dist13_local = angle1;
      llPt2_local->latitude = result.reverseAzimuth;
      DistVincenty(llIntersect,(LLPoint *)&result.distance,(InverseResult *)&angle1);
      *az32 = angle1;
      *dist23 = result.reverseAzimuth;
      llPt1_local._7_1_ = true;
    }
    else {
      llPt1_local._7_1_ = false;
    }
  }
  else {
    llPt1_local._7_1_ = false;
  }
  return llPt1_local._7_1_;
}

Assistant:

bool CrsIntersect(const LLPoint &llPt1, double az13,
                      double &az31, double &dist13, const LLPoint &llPt2, double az23,
                      double &az32, double &dist23, double dTol, LLPoint &llIntersect)
    {
        LLPoint pt1 = llPt1;
        LLPoint pt2 = llPt2;

        InverseResult result;
        DistVincenty(pt1, pt2, result);

        double angle1 = fabs(SignAzimuthDifference(az13, result.azimuth));
        double angle2 = fabs(SignAzimuthDifference(result.reverseAzimuth, az23));
        if (angle1 < 0.0 && angle2 < 0.0)
        {
            angle1 = -angle1;
            angle2 = -angle2;
        }

        if (sin(angle1) == 0.0 && sin(angle2) == 0.0)
            return false;

        // step 7
        // locate approx intersection of point3 using spherical earth model. Section 3.2

        const double cosA = cos(angle1);
        const double sinA = sin(angle1);
        const double cosB = cos(angle2);
        const double sinB = sin(angle2);

        const double C = acos(-cosA * cosB + sinA * sinB * cos(result.distance / kSphereRadius));
        const double cosC = cos(C);
        const double sinC = sin(C);
        const double a = kSphereRadius * acos((cosA + cosB * cosC) / (sinB * sinC));
        const double b = kSphereRadius * acos((cosB + cosA * cosC) / (sinA * sinC));

        if (std::isnan(a) || std::isnan(b))
            return false;

        llIntersect = DestVincenty(pt1, az13, b);
        DistVincenty(pt1, llIntersect, result);
        dist13 = result.distance;

        LLPoint llInv = llIntersect;
        llInv.latitude = -llInv.latitude;
        llInv.longitude = llInv.longitude + M_PI - M_2PI;
        DistVincenty(pt1, llInv, result);

        if (dist13 > result.distance)
        {
            llIntersect = llInv;
            dist13 = result.distance;
            az31 = result.reverseAzimuth;
            az13 = az13 + M_PI;
            az23 = az23 + M_PI;
        }

        DistVincenty(pt2, llIntersect, result);
        dist23 = result.distance;

        if (dist13 < NmToMeters(1))
        {
            pt1 = DestVincenty(pt1, az13 + M_PI, NmToMeters(1.0));
            DistVincenty(pt1, llIntersect, result);
            az13 = result.azimuth;
        }
        if (dist23 < NmToMeters(1))
        {
            pt2 = DestVincenty(pt2, az23 + M_PI, NmToMeters(1.0));
            DistVincenty(pt2, llIntersect, result);
            az23 = result.azimuth;
        }

        bool bSwapped = false;
        if (dist23 < dist13)
        {
            std::swap(pt1, pt2);
            std::swap(az13, az23);
            dist13 = dist23;
            bSwapped = true;
        }

        double distarray[2], errarray[2];
        distarray[0] = dist13;
        distarray[1] = 1.01 * dist13;

        llIntersect = DestVincenty(pt1, az13, dist13);
        DistVincenty(pt2, llIntersect, result);
        errarray[0] = SignAzimuthDifference(result.azimuth, az23);

        llIntersect = DestVincenty(pt1, az13, distarray[1]);
        DistVincenty(pt2, llIntersect, result);
        errarray[1] = SignAzimuthDifference(result.azimuth, az23);

        const int nMaxCount = 15;
        double dErr = 0.0;
        int k = 0;
        while (k == 0 || ((dErr > dTol) && (k <= nMaxCount)))
        {
            FindLinearRoot(distarray, errarray, dist13);
            if (std::isnan(dist13))
                break;

            LLPoint newPt = DestVincenty(pt1, az13, dist13);
            DistVincenty(pt2, newPt, result);
            errarray[0] = errarray[1];
            errarray[1] = SignAzimuthDifference(result.azimuth, az23);
            distarray[0] = distarray[1];
            distarray[1] = dist13;

            DistVincenty(newPt, llIntersect, result);
            dErr = result.distance;
            llIntersect = newPt;
            k++;
        }

        // display if k == maxinteratorcount (10) and show error message
        // because results might not have converged.
        if (k > nMaxCount && dErr > 1e-8)
            return false;

        if (bSwapped)
        {
            std::swap(pt1, pt2);
            std::swap(az13, az23);
            dist13 = dist23;
        }
        DistVincenty(llIntersect, pt1, result);
        az31 = result.azimuth;
        dist13 = result.distance;

        DistVincenty(llIntersect, pt2, result);
        az32 = result.azimuth;
        dist23 = result.distance;

        return true;
    }